

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O0

ParseStatus ReadHeader(MemBuffer *mem)

{
  uint32_t uVar1;
  size_t sVar2;
  int *piVar3;
  uint8_t *puVar4;
  MemBuffer *in_RDI;
  uint32_t riff_size;
  size_t min_size;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ParseStatus local_4;
  
  sVar2 = MemDataSize(in_RDI);
  if (sVar2 < 0x14) {
    local_4 = PARSE_NEED_MORE_DATA;
  }
  else {
    piVar3 = (int *)GetBuffer(in_RDI);
    if ((*piVar3 == 0x46464952) && (puVar4 = GetBuffer(in_RDI), *(int *)(puVar4 + 8) == 0x50424557))
    {
      GetBuffer(in_RDI);
      uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (uVar1 < 8) {
        return PARSE_ERROR;
      }
      if (0xfffffff6 < uVar1) {
        return PARSE_ERROR;
      }
      in_RDI->riff_end_ = (ulong)(uVar1 + 8);
      if (in_RDI->riff_end_ < in_RDI->buf_size_) {
        in_RDI->end_ = in_RDI->riff_end_;
        in_RDI->buf_size_ = in_RDI->riff_end_;
      }
      Skip(in_RDI,0xc);
      return PARSE_OK;
    }
    local_4 = PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static size_t ReadHeader(PNMInfo* const info) {
  size_t off = 0;
  char out[MAX_LINE_SIZE + 1];
  size_t out_size;
  if (info == NULL) return 0;
  if (info->data == NULL || info->data_size < kMinPNMHeaderSize) return 0;

  info->width = info->height = 0;
  info->type = -1;
  info->seen_flags = 0;
  info->bytes_per_px = 0;
  info->depth = 0;
  info->max_value = 0;

  off = ReadLine(info->data, off, info->data_size, out, &out_size);
  if (off == 0 || sscanf(out, "P%d", &info->type) != 1) return 0;
  if (info->type == 7) {
    off = ReadPAMFields(info, off);
  } else {
    off = ReadLine(info->data, off, info->data_size, out, &out_size);
    if (off == 0 || sscanf(out, "%d %d", &info->width, &info->height) != 2) {
      return 0;
    }
    off = ReadLine(info->data, off, info->data_size, out, &out_size);
    if (off == 0 || sscanf(out, "%d", &info->max_value) != 1) return 0;

    // finish initializing missing fields
    info->depth = (info->type == 5) ? 1 : 3;
  }
  // perform some basic numerical validation
  if (info->width <= 0 || info->height <= 0 ||
      info->type <= 0 || info->type >= 9 ||
      info->depth <= 0 || info->depth > 4 ||
      info->max_value <= 0 || info->max_value >= 65536) {
    return 0;
  }
  info->bytes_per_px = info->depth * (info->max_value > 255 ? 2 : 1);
  return off;
}